

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pTexture,Uint32 MipLevel,
          Uint32 ArraySlice)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar2;
  uint uVar3;
  string msg;
  
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>(&msg,(char (*) [26])0x7eac81);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x75f);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar1 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  if (*(uint *)(CONCAT44(extraout_var,iVar1) + 0x1c) <= MipLevel) {
    FormatString<char[26]>(&msg,(char (*) [26])"Mip level is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x760);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar1 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  uVar2 = 1;
  uVar3 = (uint)*(byte *)(CONCAT44(extraout_var_00,iVar1) + 8);
  if ((uVar3 < 9) && ((0x1a8U >> (uVar3 & 0x1f) & 1) != 0)) {
    uVar2 = *(uint *)(CONCAT44(extraout_var_00,iVar1) + 0x14);
  }
  if (uVar2 <= ArraySlice) {
    FormatString<char[28]>(&msg,(char (*) [28])"Array slice is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UnmapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x761);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapTextureSubresource(
    ITexture* pTexture,
    Uint32    MipLevel,
    Uint32    ArraySlice)
{
    DEV_CHECK_ERR(pTexture, "pTexture must not be null");
    DEV_CHECK_ERR(MipLevel < pTexture->GetDesc().MipLevels, "Mip level is out of range");
    DEV_CHECK_ERR(ArraySlice < pTexture->GetDesc().GetArraySize(), "Array slice is out of range");
}